

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.h
# Opt level: O2

_Bool run_container_remove(run_container_t *run,uint16_t pos)

{
  uint16_t uVar1;
  ushort uVar2;
  rle16_t *prVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar4 = interleavedBinarySearch(run->runs,run->n_runs,pos);
  if ((int)uVar4 < 0) {
    if (uVar4 == 0xffffffff) {
      return false;
    }
    uVar5 = -uVar4 - 2;
    prVar3 = run->runs;
    uVar6 = (uint)pos - (uint)prVar3[uVar5].value;
    uVar2 = prVar3[uVar5].length;
    if ((int)uVar6 < (int)(uint)uVar2) {
      prVar3[uVar5].length = (ushort)uVar6 - 1;
      uVar4 = ~uVar4;
      makeRoomAtIndex(run,(uint16_t)uVar4);
      prVar3 = run->runs;
      prVar3[uVar4].value = pos + 1;
      prVar3[uVar4].length = uVar2 + ~(ushort)uVar6;
    }
    else {
      if (uVar6 != uVar2) {
        return false;
      }
      prVar3[uVar5].length = uVar2 - 1;
    }
  }
  else {
    prVar3 = run->runs;
    uVar1 = prVar3[uVar4].length;
    if (uVar1 == 0) {
      uVar4 = uVar4 & 0xffff;
      memmove(prVar3 + uVar4,prVar3 + (ulong)uVar4 + 1,(long)(int)(~uVar4 + run->n_runs) << 2);
      run->n_runs = run->n_runs + -1;
    }
    else {
      prVar3[uVar4].value = prVar3[uVar4].value + 1;
      prVar3[uVar4].length = uVar1 - 1;
    }
  }
  return true;
}

Assistant:

static inline bool run_container_remove(run_container_t *run, uint16_t pos) {
    int32_t index = interleavedBinarySearch(run->runs, run->n_runs, pos);
    if (index >= 0) {
        int32_t le = run->runs[index].length;
        if (le == 0) {
            recoverRoomAtIndex(run, (uint16_t)index);
        } else {
            run->runs[index].value++;
            run->runs[index].length--;
        }
        return true;
    }
    index = -index - 2;  // points to preceding value, possibly -1
    if (index >= 0) {    // possible match
        int32_t offset = pos - run->runs[index].value;
        int32_t le = run->runs[index].length;
        if (offset < le) {
            // need to break in two
            run->runs[index].length = (uint16_t)(offset - 1);
            // need to insert
            uint16_t newvalue = pos + 1;
            int32_t newlength = le - offset - 1;
            makeRoomAtIndex(run, (uint16_t)(index + 1));
            run->runs[index + 1].value = newvalue;
            run->runs[index + 1].length = (uint16_t)newlength;
            return true;

        } else if (offset == le) {
            run->runs[index].length--;
            return true;
        }
    }
    // no match
    return false;
}